

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs,
          char *filename)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  pointer pcVar4;
  reference value_00;
  cmExpandedCommandArgument local_128;
  ulong local_100;
  size_t j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  cmExpandedCommandArgument local_b8;
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_90;
  cmListFileArgument *local_88;
  undefined1 local_70 [8];
  string value;
  const_iterator i;
  string efp;
  char *filename_local;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs_local;
  cmMakefile *this_local;
  
  GetExecutionFilePath_abi_cxx11_((string *)&i,this);
  efp.field_2._8_8_ = filename;
  if (filename == (char *)0x0) {
    efp.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  __gnu_cxx::
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  ::__normal_iterator((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                       *)((long)&value.field_2 + 8));
  std::__cxx11::string::string((string *)local_70);
  sVar3 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(inArgs);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (outArgs,sVar3);
  local_88 = (cmListFileArgument *)
             std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(inArgs);
  value.field_2._8_8_ = local_88;
  while( true ) {
    local_90._M_current =
         (cmListFileArgument *)
         std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(inArgs);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                        *)((long)&value.field_2 + 8),&local_90);
    if (!bVar2) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
             ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                           *)((long)&value.field_2 + 8));
    if (pcVar4->Delim == Bracket) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      cmExpandedCommandArgument::cmExpandedCommandArgument(&local_b8,&pcVar4->Value,true);
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::push_back
                (outArgs,&local_b8);
      cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_b8);
    }
    else {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_70,(string *)pcVar4);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      ExpandVariablesInString
                (this,(string *)local_70,false,false,false,(char *)efp.field_2._8_8_,pcVar4->Line,
                 false,false);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      if (pcVar4->Delim == Quoted) {
        cmExpandedCommandArgument::cmExpandedCommandArgument
                  ((cmExpandedCommandArgument *)
                   &stringArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_70,true);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        push_back(outArgs,(value_type *)
                          &stringArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmExpandedCommandArgument::~cmExpandedCommandArgument
                  ((cmExpandedCommandArgument *)
                   &stringArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j);
        cmSystemTools::ExpandListArgument
                  ((string *)local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&j,false);
        for (local_100 = 0; uVar1 = local_100,
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&j), uVar1 < sVar3; local_100 = local_100 + 1) {
          value_00 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&j,local_100);
          cmExpandedCommandArgument::cmExpandedCommandArgument(&local_128,value_00,false);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          push_back(outArgs,&local_128);
          cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_128);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&j);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                  *)((long)&value.field_2 + 8));
  }
  bVar2 = cmSystemTools::GetFatalErrorOccured();
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&i);
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<cmExpandedCommandArgument>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename) {
    filename = efp.c_str();
  }
  std::vector<cmListFileArgument>::const_iterator i;
  std::string value;
  outArgs.reserve(inArgs.size());
  for (i = inArgs.begin(); i != inArgs.end(); ++i) {
    // No expansion in a bracket argument.
    if (i->Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(cmExpandedCommandArgument(i->Value, true));
      continue;
    }
    // Expand the variables in the argument.
    value = i->Value;
    this->ExpandVariablesInString(value, false, false, false, filename,
                                  i->Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i->Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(cmExpandedCommandArgument(value, true));
    } else {
      std::vector<std::string> stringArgs;
      cmSystemTools::ExpandListArgument(value, stringArgs);
      for (size_t j = 0; j < stringArgs.size(); ++j) {
        outArgs.push_back(cmExpandedCommandArgument(stringArgs[j], false));
      }
    }
  }
  return !cmSystemTools::GetFatalErrorOccured();
}